

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O1

void Fxu_HeapSingleDelete(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  int iVar1;
  int iVar2;
  Fxu_Single *pSingle_00;
  long lVar3;
  
  iVar1 = pSingle->HNum;
  lVar3 = (long)iVar1;
  if ((0 < lVar3) && (iVar1 <= p->nItemsAlloc)) {
    iVar2 = p->nItems;
    p->nItems = iVar2 + -1;
    p->pTree[lVar3] = p->pTree[iVar2];
    pSingle_00 = p->pTree[lVar3];
    pSingle_00->HNum = iVar1;
    Fxu_HeapSingleUpdate(p,pSingle_00);
    pSingle->HNum = 0;
    return;
  }
  __assert_fail("(pSingle)->HNum >= 1 && (pSingle)->HNum <= p->nItemsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuHeapS.c"
                ,0xfe,"void Fxu_HeapSingleDelete(Fxu_HeapSingle *, Fxu_Single *)");
}

Assistant:

void Fxu_HeapSingleDelete( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    int Place = pSingle->HNum;
	FXU_HEAP_SINGLE_ASSERT(p,pSingle);
	// put the last entry to the deleted place
	// decrement the number of entries
	p->pTree[Place] = p->pTree[p->nItems--];
	p->pTree[Place]->HNum = Place;
	// move the top entry down if necessary
	Fxu_HeapSingleUpdate( p, p->pTree[Place] );
    pSingle->HNum = 0;
}